

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O1

void __thiscall
Simple::Lib::ProtoSignal<int_(),_Simple::CollectorVector<int>_>::~ProtoSignal
          (ProtoSignal<int_(),_Simple::CollectorVector<int>_> *this)

{
  SignalLink *this_00;
  char *in_RSI;
  
  if (this->callback_ring_ == (SignalLink *)0x0) {
    return;
  }
  while( true ) {
    this_00 = this->callback_ring_;
    if (this_00->next == this_00) break;
    SignalLink::unlink(this_00->next,in_RSI);
  }
  if (this_00->ref_count < 2) {
    __assert_fail("callback_ring_->ref_count >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/SimpleSignal.h"
                  ,0x9a,
                  "Simple::Lib::ProtoSignal<int (), Simple::CollectorVector<int>>::~ProtoSignal()");
  }
  SignalLink::decref(this_00);
  SignalLink::decref(this->callback_ring_);
  return;
}

Assistant:

~ProtoSignal ()
  {
    if (callback_ring_)
      {
        while (callback_ring_->next != callback_ring_)
          callback_ring_->next->unlink();
        assert (callback_ring_->ref_count >= 2);
        callback_ring_->decref();
        callback_ring_->decref();
      }
  }